

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O3

Pipeline * __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::RpcRequest::sendForPipeline
          (Pipeline *__return_storage_ptr__,RpcRequest *this)

{
  uint *puVar1;
  ushort uVar2;
  RpcConnectionState *pRVar3;
  RpcClient *pRVar4;
  void *pvVar5;
  undefined8 uVar6;
  PointerReader other;
  undefined8 uVar7;
  undefined8 uVar8;
  RequestHook *pRVar9;
  byte bVar10;
  PipelineHook *pPVar11;
  uint uVar12;
  Refcounted *refcounted_1;
  Refcounted *refcounted;
  void *__buf;
  int in_R8D;
  MessageSizeCounts MVar13;
  Request<capnp::AnyPointer,_capnp::AnyPointer> replacement;
  size_t sVar14;
  undefined1 local_270 [8];
  WordCountN<61,_uint64_t> local_268;
  uint local_260;
  PointerReader local_258;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  long local_208;
  uint local_1f8;
  undefined1 local_1e8 [32];
  RequestHook *pRStack_1c8;
  RpcClient *local_1c0;
  StructBuilder local_58;
  
  pRVar3 = (this->connectionState).ptr;
  if ((pRVar3->connection).tag != 1) {
    kj::Exception::Exception((Exception *)local_1e8,(Exception *)&(pRVar3->connection).field_1);
    newBrokenPipeline((capnp *)&local_258,(Exception *)local_1e8);
    (__return_storage_ptr__->hook).disposer = (Disposer *)local_258.segment;
    (__return_storage_ptr__->hook).ptr = (PipelineHook *)local_258.capTable;
    local_258.capTable = (CapTableReader *)0x0;
    (__return_storage_ptr__->ops).disposer = (ArrayDisposer *)0x0;
    (__return_storage_ptr__->ops).ptr = (PipelineOp *)0x0;
    (__return_storage_ptr__->ops).size_ = 0;
    kj::Exception::~Exception((Exception *)local_1e8);
    return __return_storage_ptr__;
  }
  pRVar4 = (this->target).ptr;
  local_1e8._16_8_ = (this->callBuilder)._builder.pointers;
  local_1e8._0_8_ = (this->callBuilder)._builder.segment;
  local_1e8._8_8_ = (this->callBuilder)._builder.capTable;
  PointerBuilder::getStruct(&local_58,(PointerBuilder *)local_1e8,(StructSize)0x10001,(word *)0x0);
  sVar14 = local_58._32_8_;
  (*(pRVar4->super_ClientHook)._vptr_ClientHook[10])(local_1e8,pRVar4);
  uVar8 = local_1e8._8_8_;
  uVar7 = local_1e8._0_8_;
  if ((Disposer *)local_1e8._8_8_ == (Disposer *)0x0) {
    if (((this->connectionState).ptr)->gotReturnForHighQuestionId != true) {
      sendForPipelineInternal((RpcRequest *)local_1e8);
      pRVar3 = (this->connectionState).ptr;
      pPVar11 = (PipelineHook *)operator_new(0x228);
      pPVar11->_vptr_PipelineHook = (_func_int **)&PTR_addRef_006ce2e8;
      pPVar11[1]._vptr_PipelineHook = (_func_int **)&PTR_disposeImpl_006ce320;
      puVar1 = &(pRVar3->super_Refcounted).refcount;
      *puVar1 = *puVar1 + 1;
      pPVar11[3]._vptr_PipelineHook = (_func_int **)&pRVar3->super_Refcounted;
      pPVar11[4]._vptr_PipelineHook = (_func_int **)pRVar3;
      *(undefined1 *)&pPVar11[5]._vptr_PipelineHook = 0;
      pPVar11[0x3b]._vptr_PipelineHook = (_func_int **)0x0;
      pPVar11[0x3c]._vptr_PipelineHook = (_func_int **)0x0;
      pPVar11[0x3d]._vptr_PipelineHook = (_func_int **)0x0;
      pPVar11[0x3e]._vptr_PipelineHook = (_func_int **)&kj::NullArrayDisposer::instance;
      pPVar11[0x40]._vptr_PipelineHook = (_func_int **)0x0;
      pPVar11[0x41]._vptr_PipelineHook = (_func_int **)0x0;
      pPVar11[0x42]._vptr_PipelineHook = (_func_int **)0x0;
      pPVar11[0x43]._vptr_PipelineHook = (_func_int **)0x0;
      pPVar11[0x44]._vptr_PipelineHook = (_func_int **)0x0;
      pPVar11[9]._vptr_PipelineHook = (_func_int **)local_1e8._0_8_;
      pPVar11[10]._vptr_PipelineHook = (_func_int **)local_1e8._8_8_;
      *(undefined4 *)&pPVar11[8]._vptr_PipelineHook = 1;
      *(undefined4 *)&pPVar11[2]._vptr_PipelineHook = 1;
      (__return_storage_ptr__->hook).disposer = (Disposer *)(pPVar11 + 1);
      (__return_storage_ptr__->hook).ptr = pPVar11;
      (__return_storage_ptr__->ops).ptr = (PipelineOp *)0x0;
      (__return_storage_ptr__->ops).size_ = 0;
      (__return_storage_ptr__->ops).disposer = (ArrayDisposer *)0x0;
      return __return_storage_ptr__;
    }
    send((RpcRequest *)local_1e8,(int)this,__buf,local_58._32_8_,in_R8D);
    uVar7 = local_1e8._0_8_;
    (__return_storage_ptr__->hook).disposer = (Disposer *)local_1e8._8_8_;
    (__return_storage_ptr__->hook).ptr = (PipelineHook *)local_1e8._16_8_;
    local_1e8._16_8_ = (WirePointer *)0x0;
    (__return_storage_ptr__->ops).ptr = (PipelineOp *)local_1e8._24_8_;
    (__return_storage_ptr__->ops).size_ = (size_t)pRStack_1c8;
    (__return_storage_ptr__->ops).disposer = (ArrayDisposer *)local_1c0;
    local_1e8._24_8_ = (RpcConnectionState *)0x0;
    pRStack_1c8 = (RequestHook *)0x0;
    if ((SegmentBuilder *)local_1e8._0_8_ == (SegmentBuilder *)0x0) {
      return __return_storage_ptr__;
    }
    local_1e8._0_8_ = (SegmentBuilder *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar7);
    return __return_storage_ptr__;
  }
  pvVar5 = (this->callBuilder)._builder.data;
  uVar6 = *(undefined8 *)((long)pvVar5 + 8);
  uVar2 = *(ushort *)((long)pvVar5 + 4);
  PointerBuilder::asReader(&(this->paramsBuilder).builder);
  MVar13 = PointerReader::targetSize(&local_258);
  local_268 = MVar13.wordCount;
  local_270[0] = 1;
  local_260 = MVar13.capCount;
  StructBuilder::asReader(&(this->callBuilder)._builder);
  if (local_1f8 < 0x82) {
    bVar10 = 0;
  }
  else {
    bVar10 = *(byte *)(local_208 + 0x10) >> 1 & 1;
    if (local_1f8 != 0x82) {
      uVar12 = (*(byte *)(local_208 + 0x10) & 4) << 6;
      goto LAB_00326acd;
    }
  }
  uVar12 = 0;
LAB_00326acd:
  (**((CapTableReader *)uVar8)->_vptr_CapTableReader)
            (local_1e8,uVar8,uVar6,(ulong)uVar2,local_270,(ulong)(uVar12 | bVar10),
             local_58.segment._0_4_,local_58.capTable._0_4_,local_58.data._0_4_,
             local_58.pointers._0_4_,sVar14);
  PointerBuilder::asReader(&(this->paramsBuilder).builder);
  other.capTable._0_4_ = (int)uStack_230;
  other.segment = (SegmentReader *)local_238;
  other.capTable._4_4_ = (int)((ulong)uStack_230 >> 0x20);
  other.pointer._0_4_ = (int)local_228;
  other.pointer._4_4_ = (int)((ulong)local_228 >> 0x20);
  other.nestingLimit = (int)uStack_220;
  other._28_4_ = (int)((ulong)uStack_220 >> 0x20);
  PointerBuilder::copyFrom((PointerBuilder *)local_1e8,other,false);
  Request<capnp::AnyPointer,_capnp::AnyPointer>::sendForPipeline
            (__return_storage_ptr__,(Request<capnp::AnyPointer,_capnp::AnyPointer> *)local_1e8);
  pRVar9 = pRStack_1c8;
  if (pRStack_1c8 != (RequestHook *)0x0) {
    pRStack_1c8 = (RequestHook *)0x0;
    (**((ErrorHandler *)local_1e8._24_8_)->_vptr_ErrorHandler)
              (local_1e8._24_8_,pRVar9->_vptr_RequestHook[-2] + (long)&pRVar9->_vptr_RequestHook);
  }
  (*(code *)((SegmentReader *)uVar7)->arena->_vptr_Arena)
            (uVar7,((CapTableReader *)uVar8)->_vptr_CapTableReader[-2] +
                   (long)(CapTableReader *)uVar8);
  return __return_storage_ptr__;
}

Assistant:

AnyPointer::Pipeline sendForPipeline() override {
      if (!connectionState->connection.is<Connected>()) {
        // Connection is broken.
        // TODO(bug): Seems like we should check for redirect before this?
        const kj::Exception& e = connectionState->connection.get<Disconnected>();
        return AnyPointer::Pipeline(newBrokenPipeline(kj::cp(e)));
      }

      KJ_IF_SOME(redirect, target->writeTarget(callBuilder.getTarget())) {
        // Whoops, this capability has been redirected while we were building the request!
        // We'll have to make a new request and do a copy.  Ick.

        auto replacement = redirect->newCall(
            callBuilder.getInterfaceId(), callBuilder.getMethodId(), paramsBuilder.targetSize(),
            callHintsFromReader(callBuilder));
        replacement.set(paramsBuilder);
        return replacement.sendForPipeline();
      } else if (connectionState->gotReturnForHighQuestionId) {
        // Peer doesn't implement our hints. Fall back to a regular send().
        return send();
      } else {
        auto questionRef = sendForPipelineInternal();
        kj::Own<PipelineHook> pipeline = kj::refcounted<RpcPipeline>(
            *connectionState, kj::mv(questionRef));
        return AnyPointer::Pipeline(kj::mv(pipeline));
      }